

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

void __thiscall calculator::Lexer::Lexer(Lexer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type *pmVar2;
  long lVar3;
  undefined1 local_443;
  undefined1 local_442;
  undefined1 local_441;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_440;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>_>_>
  *local_438;
  key_type local_430;
  code *local_410;
  undefined8 uStack_408;
  code *local_400;
  code *pcStack_3f8;
  undefined1 *local_3f0 [2];
  undefined1 local_3e0 [16];
  code *local_3d0;
  undefined8 uStack_3c8;
  code *local_3c0;
  code *pcStack_3b8;
  long *local_3b0 [2];
  long local_3a0 [2];
  code *local_390;
  undefined8 uStack_388;
  code *local_380 [2];
  undefined1 *local_370 [2];
  undefined1 local_360 [16];
  code *local_350;
  undefined8 uStack_348;
  code *local_340;
  code *pcStack_338;
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  code *local_310;
  undefined8 uStack_308;
  code *local_300;
  code *pcStack_2f8;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  code *local_2d0;
  undefined8 uStack_2c8;
  code *local_2c0;
  code *pcStack_2b8;
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  code *local_290;
  undefined8 uStack_288;
  code *local_280;
  code *pcStack_278;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  code *local_250;
  undefined8 uStack_248;
  code *local_240;
  code *pcStack_238;
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  code *local_210;
  undefined8 uStack_208;
  code *local_200;
  code *pcStack_1f8;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  code *local_1d0;
  undefined8 uStack_1c8;
  code *local_1c0;
  code *pcStack_1b8;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  code *local_190;
  undefined8 uStack_188;
  code *local_180;
  code *pcStack_178;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  code *local_150;
  undefined8 uStack_148;
  code *local_140;
  code *pcStack_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  code *local_110;
  undefined8 uStack_108;
  code *local_100;
  code *pcStack_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  code *local_d0;
  undefined8 uStack_c8;
  code *local_c0;
  code *pcStack_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  code *local_90;
  undefined8 uStack_88;
  code *local_80;
  code *pcStack_78;
  long *local_70 [2];
  long local_60 [2];
  undefined8 local_50;
  undefined8 uStack_48;
  code *local_40 [2];
  
  (this->constant)._M_h._M_buckets = &(this->constant)._M_h._M_single_bucket;
  (this->constant)._M_h._M_bucket_count = 1;
  (this->constant)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->constant)._M_h._M_element_count = 0;
  (this->constant)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->constant)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->constant)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_440 = &(this->variable)._M_h;
  (this->variable)._M_h._M_buckets = &(this->variable)._M_h._M_single_bucket;
  (this->variable)._M_h._M_bucket_count = 1;
  (this->variable)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->variable)._M_h._M_element_count = 0;
  (this->variable)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->variable)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->variable)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"sqrt","");
  uStack_408 = 0;
  local_410 = sqrtf64;
  pcStack_3f8 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_400 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_3f0[0] = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"ceil","");
  uStack_3c8 = 0;
  local_3d0 = ceilf64;
  pcStack_3b8 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_3c0 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"cos","");
  uStack_388 = 0;
  local_390 = cosf64;
  local_380[1] = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_380[0] = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_370[0] = local_360;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"sin","");
  uStack_348 = 0;
  local_350 = sinf64;
  pcStack_338 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_340 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"tan","");
  uStack_308 = 0;
  local_310 = tanf64;
  pcStack_2f8 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_300 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"log","");
  uStack_2c8 = 0;
  local_2d0 = logf64;
  pcStack_2b8 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_2c0 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"floor","");
  uStack_288 = 0;
  local_290 = floorf64;
  pcStack_278 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_280 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"acos","");
  uStack_248 = 0;
  local_250 = acosf64;
  pcStack_238 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_240 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"asin","");
  uStack_208 = 0;
  local_210 = asinf64;
  pcStack_1f8 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_200 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"atan","");
  uStack_1c8 = 0;
  local_1d0 = atanf64;
  pcStack_1b8 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_1c0 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"exp","");
  uStack_188 = 0;
  local_190 = expf64;
  pcStack_178 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_180 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"log2","");
  uStack_148 = 0;
  local_150 = log2f64;
  pcStack_138 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_140 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"log10","");
  uStack_108 = 0;
  local_110 = log10f64;
  pcStack_f8 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_100 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"erf","");
  uStack_c8 = 0;
  local_d0 = erff64;
  pcStack_b8 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_c0 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"round","");
  uStack_88 = 0;
  local_90 = roundf64;
  pcStack_78 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_invoke;
  local_80 = std::_Function_handler<double_(double),_double_(*)(double)_noexcept>::_M_manager;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"factorial","");
  local_438 = &this->unary_functions;
  local_50 = 0;
  uStack_48 = 0;
  local_40[1] = std::
                _Function_handler<double_(double),_calculator::Lexer::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/josexy[P]MyEasyCalculator/Calculator/src/../include/Lexer.h:39:23)>
                ::_M_invoke;
  local_40[0] = std::
                _Function_handler<double_(double),_calculator::Lexer::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/josexy[P]MyEasyCalculator/Calculator/src/../include/Lexer.h:39:23)>
                ::_M_manager;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<double(double)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<double(double)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::function<double(double)>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<double(double)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<double(double)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_438,&local_430,&stack0xffffffffffffffd0,0,&local_442,&local_443,&local_441);
  lVar3 = 0;
  do {
    if (*(code **)((long)local_40 + lVar3) != (code *)0x0) {
      (**(code **)((long)local_40 + lVar3))((long)&local_50 + lVar3,(long)&local_50 + lVar3,3);
    }
    if ((void *)((long)local_60 + lVar3) != *(void **)((long)local_70 + lVar3)) {
      operator_delete(*(void **)((long)local_70 + lVar3),*(long *)((long)local_60 + lVar3) + 1);
    }
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0x400);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"pow","");
  uStack_408 = 0;
  local_410 = powf64;
  pcStack_3f8 = std::_Function_handler<double_(double,_double),_double_(*)(double,_double)_noexcept>
                ::_M_invoke;
  local_400 = std::_Function_handler<double_(double,_double),_double_(*)(double,_double)_noexcept>::
              _M_manager;
  local_3f0[0] = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"max","");
  local_3d0 = (code *)0x0;
  uStack_3c8 = 0;
  pcStack_3b8 = std::
                _Function_handler<double_(double,_double),_calculator::Lexer::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/josexy[P]MyEasyCalculator/Calculator/src/../include/Lexer.h:47:17)>
                ::_M_invoke;
  local_3c0 = std::
              _Function_handler<double_(double,_double),_calculator::Lexer::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/josexy[P]MyEasyCalculator/Calculator/src/../include/Lexer.h:47:17)>
              ::_M_manager;
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"min","");
  local_390 = (code *)0x0;
  uStack_388 = 0;
  local_380[1] = std::
                 _Function_handler<double_(double,_double),_calculator::Lexer::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/josexy[P]MyEasyCalculator/Calculator/src/../include/Lexer.h:48:17)>
                 ::_M_invoke;
  local_380[0] = std::
                 _Function_handler<double_(double,_double),_calculator::Lexer::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/josexy[P]MyEasyCalculator/Calculator/src/../include/Lexer.h:48:17)>
                 ::_M_manager;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<double(double,double)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<double(double,double)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::function<double(double,double)>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<double(double,double)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<double(double,double)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->binary_functions,&local_430,local_370,0,&local_442,&local_443,&local_441);
  lVar3 = 0;
  do {
    if (*(code **)((long)local_380 + lVar3) != (code *)0x0) {
      (**(code **)((long)local_380 + lVar3))((long)&local_390 + lVar3,(long)&local_390 + lVar3,3);
    }
    if ((void *)((long)local_3a0 + lVar3) != *(void **)((long)local_3b0 + lVar3)) {
      operator_delete(*(void **)((long)local_3b0 + lVar3),*(long *)((long)local_3a0 + lVar3) + 1);
    }
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0xc0);
  this->line_ = 0;
  this->lookforward_ = '\0';
  this->is_function_ = false;
  (this->reader_).sbuffer_ = (char *)0x0;
  (this->reader_).ptr_ = -1;
  *(undefined8 *)&(this->reader_).len_ = 0;
  *(undefined8 *)
   ((long)&(this->tokenlist_).
           super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tokenlist_).
           super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tokenlist_).
           super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_map + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_map_size + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_start._M_first + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_start._M_last + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_start._M_node + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_finish._M_first + 4) = 0;
  (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<bool,_std::allocator<bool>_>::_M_initialize_map
            ((_Deque_base<bool,_std::allocator<bool>_> *)&this->bracket_match_,0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)this);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(local_440);
  std::
  vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>::
  clear(&this->tokenlist_);
  paVar1 = &local_430.field_2;
  local_430._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"pi","");
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,&local_430);
  *pmVar2 = 3.141592653589793;
  putWord(this,&local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  local_430._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"e","");
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,&local_430);
  *pmVar2 = 2.718281828459045;
  putWord(this,&local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  local_430._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"sqrt2","");
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,&local_430);
  *pmVar2 = 1.4142135623730951;
  putWord(this,&local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Lexer::Lexer() : line_(0), lookforward_(0), is_function_(false) {
    constant.clear();
    variable.clear();
    tokenlist_.clear();

    putConstant("pi", 3.141592653589793);
    putConstant("e", 2.718281828459045);
    putConstant("sqrt2", 1.4142135623730951);
}